

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

void __thiscall icu_63::number::impl::DecimalQuantity::switchStorage(DecimalQuantity *this)

{
  int8_t *buffer;
  ulong uVar1;
  long lVar2;
  int8_t *piVar3;
  uint64_t uVar4;
  
  if (this->usingBytes == true) {
    buffer = (this->fBCD).bcdBytes.ptr;
    if ((long)this->precision < 1) {
      piVar3 = (int8_t *)0x0;
    }
    else {
      uVar1 = (long)this->precision + 1;
      piVar3 = (int8_t *)0x0;
      do {
        piVar3 = (int8_t *)((long)buffer[uVar1 - 2] | (long)piVar3 << 4);
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
    }
    uprv_free_63(buffer);
    (this->fBCD).bcdBytes.ptr = piVar3;
    this->usingBytes = false;
  }
  else {
    uVar4 = (this->fBCD).bcdLong;
    ensureCapacity(this,0x28);
    if (0 < this->precision) {
      lVar2 = 0;
      do {
        (this->fBCD).bcdBytes.ptr[lVar2] = (byte)uVar4 & 0xf;
        uVar4 = uVar4 >> 4;
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->precision);
    }
  }
  return;
}

Assistant:

void DecimalQuantity::switchStorage() {
    if (usingBytes) {
        // Change from bytes to long
        uint64_t bcdLong = 0L;
        for (int i = precision - 1; i >= 0; i--) {
            bcdLong <<= 4;
            bcdLong |= fBCD.bcdBytes.ptr[i];
        }
        uprv_free(fBCD.bcdBytes.ptr);
        fBCD.bcdBytes.ptr = nullptr;
        fBCD.bcdLong = bcdLong;
        usingBytes = false;
    } else {
        // Change from long to bytes
        // Copy the long into a local variable since it will get munged when we allocate the bytes
        uint64_t bcdLong = fBCD.bcdLong;
        ensureCapacity();
        for (int i = 0; i < precision; i++) {
            fBCD.bcdBytes.ptr[i] = static_cast<int8_t>(bcdLong & 0xf);
            bcdLong >>= 4;
        }
        U_ASSERT(usingBytes);
    }
}